

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::render
          (RecreateBuffersTest *this,Context *ctx,Surface *dst)

{
  FboConfig *config;
  GLenum GVar1;
  uint uVar2;
  int i;
  DataType DVar3;
  DataType outputType;
  deUint32 program;
  deUint32 program_00;
  deUint32 program_01;
  uint uVar4;
  uint uVar5;
  long lVar6;
  deUint32 *pdVar7;
  GLenum *pGVar8;
  undefined8 uVar9;
  int in_R9D;
  int iVar10;
  bool bVar11;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  Framebuffer fbo;
  TextureFormat colorFormat;
  Vec4 fboOutScale;
  Vec4 fboOutBias;
  float local_518 [2];
  undefined1 *puStack_510;
  TextureFormatInfo fboRangeInfo;
  FlatColorShader flatShader;
  Texture2DShader texFromFboShader;
  Texture2DShader texToFboShader;
  
  colorFormat = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
  DVar3 = glu::getSampler2DType(colorFormat);
  outputType = FboTestUtil::getFragmentOutputType(&colorFormat);
  tcu::getTextureFormatInfo(&fboRangeInfo,&colorFormat);
  fboOutScale.m_data[0] = 0.0;
  fboOutScale.m_data[1] = 0.0;
  fboOutScale.m_data[2] = 0.0;
  fboOutScale.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    fboOutScale.m_data[lVar6] =
         fboRangeInfo.valueMax.m_data[lVar6] - fboRangeInfo.valueMin.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  fboOutBias.m_data[0] = fboRangeInfo.valueMin.m_data[0];
  fboOutBias.m_data[1] = fboRangeInfo.valueMin.m_data[1];
  fboOutBias.m_data[2] = fboRangeInfo.valueMin.m_data[2];
  fboOutBias.m_data[3] = fboRangeInfo.valueMin.m_data[3];
  texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader =
       (_func_int **)
       CONCAT44(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader._4_4_,0x28);
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&texFromFboShader,(iterator)0x0,
             (DataType *)&flatShader);
  config = &(this->super_FboRenderCase).m_config;
  lVar6 = 0;
  do {
    *(undefined4 *)
     ((long)&flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader + lVar6 * 4) =
         0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  fbo.m_config.buffers = 0;
  fbo.m_config.colorType = 0;
  fbo.m_config.colorFormat = 0;
  fbo.m_config.depthStencilType = 0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texToFboShader,(DataTypes *)&texFromFboShader,outputType,(Vec4 *)&flatShader,
             (Vec4 *)&fbo);
  if (texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader !=
      (_func_int **)0x0) {
    operator_delete(texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)texFromFboShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader
                   );
  }
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  fbo.m_config.buffers = DVar3;
  std::vector<glu::DataType,std::allocator<glu::DataType>>::_M_realloc_insert<glu::DataType_const&>
            ((vector<glu::DataType,std::allocator<glu::DataType>> *)&flatShader,(iterator)0x0,
             (DataType *)&fbo);
  lVar6 = 0;
  do {
    (&fbo.m_config.buffers)[lVar6] = 0x3f800000;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texFromFboShader,(DataTypes *)&flatShader,TYPE_FLOAT_VEC4,(Vec4 *)&fbo,&res_2);
  if (flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader,
                    (long)flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader);
  }
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,outputType);
  program = (*ctx->_vptr_Context[0x75])(ctx,&texToFboShader);
  program_00 = (*ctx->_vptr_Context[0x75])(ctx,&texFromFboShader);
  program_01 = (*ctx->_vptr_Context[0x75])(ctx,&flatShader);
  uVar5 = config->buffers;
  createQuadsTex2D(ctx,2,0x1907,0x40,0x40,in_R9D);
  createMetaballsTex2D(ctx,1,0x1907,0x40,0x40,in_R9D);
  Functional::Framebuffer::Framebuffer(&fbo,ctx,config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fbo);
  FboTestUtil::Texture2DShader::setOutScaleBias(&texToFboShader,&fboOutScale,&fboOutBias);
  FboTestUtil::Texture2DShader::setTexScaleBias
            (&texFromFboShader,0,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias);
  FboTestUtil::Texture2DShader::setUniforms(&texToFboShader,ctx,program);
  FboTestUtil::Texture2DShader::setUniforms(&texFromFboShader,ctx,program_00);
  local_518[0] = 0.0;
  local_518[1] = 0.0;
  puStack_510 = &DAT_3f8000003f800000;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_1.m_data[lVar6] = local_518[lVar6] * fboOutScale.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar6 = 0;
  do {
    res_2.m_data[lVar6] = res_1.m_data[lVar6] + fboOutBias.m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  FboTestUtil::FlatColorShader::setColor(&flatShader,ctx,program_01,&res_2);
  (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  (*ctx->_vptr_Context[5])(ctx,0,0,0x80,0x80);
  res_2.m_data[0] = 1.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 1.0;
  FboTestUtil::clearColorBuffer(ctx,&colorFormat,&res_2);
  (*ctx->_vptr_Context[0x2d])(ctx,0x500);
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  (*ctx->_vptr_Context[6])(ctx,0xde1,2);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
  sglr::drawQuad(ctx,program,(Vec3 *)&res_2,(Vec3 *)&res_1);
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xc11);
    (*ctx->_vptr_Context[0x32])(ctx,0x20,0x20,0x40,0x40);
    (*ctx->_vptr_Context[0x2c])(ctx,1);
    (*ctx->_vptr_Context[0x2d])(ctx,0x400);
    (*ctx->_vptr_Context[0x34])(ctx,0xc11);
  }
  if (this->m_rebind == false) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
  }
  iVar10 = 1;
  do {
    bVar11 = iVar10 != 1;
    uVar4 = 0x500;
    if (!bVar11) {
      uVar4 = 0x4000;
    }
    GVar1 = (&fbo.m_config.colorType)[(ulong)bVar11 * 2];
    uVar2 = (&fbo.m_config.colorFormat)[(ulong)bVar11 * 2];
    pdVar7 = &fbo.m_depthStencilBuffer;
    if (!bVar11) {
      pdVar7 = &fbo.m_colorBuffer;
    }
    res_2.m_data[0] = (float)*pdVar7;
    if ((this->m_buffers & uVar4) != 0) {
      if (GVar1 == 0x8d41) {
        (*ctx->_vptr_Context[0xe])(ctx,1,&res_2);
        (*ctx->_vptr_Context[0xc])(ctx,0x8d41,res_2.m_data._0_8_ & 0xffffffff);
        (*ctx->_vptr_Context[0x23])(ctx,0x8d41,(ulong)uVar2,0x80,0x80);
      }
      else if (GVar1 == 0xde1) {
        (*ctx->_vptr_Context[8])(ctx,1,&res_2);
        (*ctx->_vptr_Context[6])(ctx,0xde1,res_2.m_data._0_8_ & 0xffffffff);
        (*ctx->_vptr_Context[0x7e])(ctx,0xde1,0,(ulong)uVar2,0x80,0x80);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2801,0x2600);
        (*ctx->_vptr_Context[0x1d])(ctx,0xde1,0x2800,0x2600);
      }
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 == 0);
  if (this->m_rebind == true) {
    iVar10 = 1;
    do {
      uVar4 = 0x4000;
      if (iVar10 != 1) {
        if (iVar10 == 0) {
          uVar4 = 0x100;
        }
        else {
          uVar4 = (uint)(iVar10 == -1) << 10;
        }
      }
      uVar9 = 0x8ce0;
      pGVar8 = &fbo.m_config.colorType;
      if (iVar10 != 1) {
        if (iVar10 == 0) {
          uVar9 = 0x8d00;
        }
        else {
          uVar9 = 0;
          if (iVar10 == -1) {
            uVar9 = 0x8d20;
          }
        }
        pGVar8 = &fbo.m_config.depthStencilType;
      }
      if ((this->m_buffers & uVar4) != 0) {
        if (*pGVar8 == 0x8d41) {
          (*ctx->_vptr_Context[0x20])
                    (ctx,0x8d40,uVar9,0x8d41,(ulong)(&fbo.m_colorBuffer)[iVar10 != 1]);
        }
        else if (*pGVar8 == 0xde1) {
          (*ctx->_vptr_Context[0x1e])
                    (ctx,0x8d40,uVar9,0xde1,(ulong)(&fbo.m_colorBuffer)[iVar10 != 1],0);
        }
      }
      iVar10 = iVar10 + -1;
    } while (iVar10 != -2);
  }
  if (this->m_rebind == false) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,(ulong)fbo.m_framebuffer);
  }
  (*ctx->_vptr_Context[0x2c])(ctx,0);
  (*ctx->_vptr_Context[0x2d])(ctx,(ulong)(this->m_buffers & 0x500));
  if ((this->m_buffers & 0x4000) != 0) {
    res_2.m_data[0] = -1.0;
    res_2.m_data[1] = -1.0;
    res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
    res_1.m_data._0_8_ = &DAT_3f8000003f800000;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(ctx,program_01,(Vec3 *)&res_2,(Vec3 *)&res_1);
  }
  (*ctx->_vptr_Context[0x33])(ctx,0xb71);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x33])(ctx,0xb90);
    (*ctx->_vptr_Context[0x35])(ctx,0x202,0,0xff);
  }
  (*ctx->_vptr_Context[6])(ctx,0xde1,1);
  res_2.m_data[0] = -1.0;
  res_2.m_data[1] = -1.0;
  res_2.m_data[2] = 1.0;
  res_1.m_data._0_8_ = &DAT_3f8000003f800000;
  res_1.m_data[2] = -1.0;
  sglr::drawQuad(ctx,program,(Vec3 *)&res_2,(Vec3 *)&res_1);
  if ((uVar5 >> 10 & 1) != 0) {
    (*ctx->_vptr_Context[0x34])(ctx,0xb90);
  }
  (*ctx->_vptr_Context[0x34])(ctx,0xb71);
  if (fbo.m_config.colorType == 0xde1) {
    (*ctx->_vptr_Context[9])(ctx,0x8d40,0);
    (*ctx->_vptr_Context[6])(ctx,0xde1,(ulong)fbo.m_colorBuffer);
    uVar5 = (*ctx->_vptr_Context[2])(ctx);
    uVar4 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[5])(ctx,0,0,(ulong)uVar5,(ulong)uVar4);
    res_2.m_data[0] = -1.0;
    res_2.m_data[1] = -1.0;
    res_2.m_data._8_8_ = res_2.m_data._8_8_ & 0xffffffff00000000;
    res_1.m_data._0_8_ = &DAT_3f8000003f800000;
    res_1.m_data._8_8_ = res_1.m_data._8_8_ & 0xffffffff00000000;
    sglr::drawQuad(ctx,program_00,(Vec3 *)&res_2,(Vec3 *)&res_1);
    uVar5 = (*ctx->_vptr_Context[2])(ctx);
    uVar4 = (*ctx->_vptr_Context[3])(ctx);
    (*ctx->_vptr_Context[0x80])(ctx,dst,0,0,(ulong)uVar5,(ulong)uVar4);
  }
  else {
    FboTestUtil::readPixels
              (ctx,dst,0,0,0x80,0x80,&colorFormat,&fboRangeInfo.lookupScale,&fboRangeInfo.lookupBias
              );
  }
  Functional::Framebuffer::~Framebuffer(&fbo);
  sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texFromFboShader);
  FboTestUtil::Texture2DShader::~Texture2DShader(&texToFboShader);
  return;
}

Assistant:

void RecreateBuffersTest::render (sglr::Context& ctx, Surface& dst)
{
	tcu::TextureFormat		colorFormat			= glu::mapGLInternalFormat(m_config.colorFormat);
	glu::DataType			fboSamplerType		= glu::getSampler2DType(colorFormat);
	glu::DataType			fboOutputType		= getFragmentOutputType(colorFormat);
	tcu::TextureFormatInfo	fboRangeInfo		= tcu::getTextureFormatInfo(colorFormat);
	Vec4					fboOutScale			= fboRangeInfo.valueMax - fboRangeInfo.valueMin;
	Vec4					fboOutBias			= fboRangeInfo.valueMin;

	Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, fboOutputType);
	Texture2DShader			texFromFboShader	(DataTypes() << fboSamplerType, glu::TYPE_FLOAT_VEC4);
	FlatColorShader			flatShader			(fboOutputType);
	deUint32				texToFboShaderID	= ctx.createProgram(&texToFboShader);
	deUint32				texFromFboShaderID	= ctx.createProgram(&texFromFboShader);
	deUint32				flatShaderID		= ctx.createProgram(&flatShader);

	int						width				= 128;
	int						height				= 128;
	deUint32				metaballsTex		= 1;
	deUint32				quadsTex			= 2;
	bool					stencil				= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	createQuadsTex2D(ctx, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createMetaballsTex2D(ctx, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	Framebuffer fbo(ctx, m_config, width, height);
	fbo.checkCompleteness();

	// Setup shaders
	texToFboShader.setOutScaleBias(fboOutScale, fboOutBias);
	texFromFboShader.setTexScaleBias(0, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	texToFboShader.setUniforms	(ctx, texToFboShaderID);
	texFromFboShader.setUniforms(ctx, texFromFboShaderID);
	flatShader.setColor			(ctx, flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f) * fboOutScale + fboOutBias);

	// Draw scene
	ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());
	ctx.viewport(0, 0, width, height);
	clearColorBuffer(ctx, colorFormat, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
	ctx.clear(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	ctx.enable(GL_DEPTH_TEST);

	ctx.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	ctx.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		ctx.enable(GL_SCISSOR_TEST);
		ctx.scissor(width/4, height/4, width/2, height/2);
		ctx.clearStencil(1);
		ctx.clear(GL_STENCIL_BUFFER_BIT);
		ctx.disable(GL_SCISSOR_TEST);
	}

	// Recreate buffers
	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

	DE_ASSERT((m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == 0 ||
			  (m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)) == (m_config.buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)));

	// Recreate.
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT
									   : (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
		deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
									   : fbo.getConfig().depthStencilType;
		deUint32	format	= ndx == 0 ? fbo.getConfig().colorFormat
									   : fbo.getConfig().depthStencilFormat;
		deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
									   : fbo.getDepthStencilBuffer();

		if ((m_buffers & bit) == 0)
			continue;

		switch (type)
		{
			case GL_TEXTURE_2D:
				ctx.deleteTextures(1, &buf);
				ctx.bindTexture(GL_TEXTURE_2D, buf);
				ctx.texImage2D(GL_TEXTURE_2D, 0, format, width, height);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
				ctx.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
				break;

			case GL_RENDERBUFFER:
				ctx.deleteRenderbuffers(1, &buf);
				ctx.bindRenderbuffer(GL_RENDERBUFFER, buf);
				ctx.renderbufferStorage(GL_RENDERBUFFER, format, width, height);
				break;

			default:
				DE_ASSERT(false);
		}
	}

	// Rebind.
	if (m_rebind)
	{
		for (int ndx = 0; ndx < 3; ndx++)
		{
			deUint32	bit		= ndx == 0 ? GL_COLOR_BUFFER_BIT	:
								  ndx == 1 ? GL_DEPTH_BUFFER_BIT	:
								  ndx == 2 ? GL_STENCIL_BUFFER_BIT	: 0;
			deUint32	point	= ndx == 0 ? GL_COLOR_ATTACHMENT0	:
								  ndx == 1 ? GL_DEPTH_ATTACHMENT	:
								  ndx == 2 ? GL_STENCIL_ATTACHMENT	: 0;
			deUint32	type	= ndx == 0 ? fbo.getConfig().colorType
										   : fbo.getConfig().depthStencilType;
			deUint32	buf		= ndx == 0 ? fbo.getColorBuffer()
										   : fbo.getDepthStencilBuffer();

			if ((m_buffers & bit) == 0)
				continue;

			switch (type)
			{
				case GL_TEXTURE_2D:
					ctx.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, buf, 0);
					break;

				case GL_RENDERBUFFER:
					ctx.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, buf);
					break;

				default:
					DE_ASSERT(false);
			}
		}
	}

	if (!m_rebind)
		ctx.bindFramebuffer(GL_FRAMEBUFFER, fbo.getFramebuffer());

	ctx.clearStencil(0);
	ctx.clear(m_buffers & (GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT)); // \note Clear only buffers that were re-created
	if (m_buffers & GL_COLOR_BUFFER_BIT)
	{
		// Clearing of integer buffers is undefined so do clearing by rendering flat color.
		sglr::drawQuad(ctx, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	}

	ctx.enable(GL_DEPTH_TEST);

	if (stencil)
	{
		// \note Stencil test enabled only if we have stencil buffer
		ctx.enable(GL_STENCIL_TEST);
		ctx.stencilFunc(GL_EQUAL, 0, 0xffu);
	}
	ctx.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(ctx, texToFboShaderID, Vec3(-1.0f, -1.0f, 1.0f), Vec3(1.0f, 1.0f, -1.0f));
	if (stencil)
		ctx.disable(GL_STENCIL_TEST);

	ctx.disable(GL_DEPTH_TEST);

	if (fbo.getConfig().colorType == GL_TEXTURE_2D)
	{
		// Unbind fbo
		ctx.bindFramebuffer(GL_FRAMEBUFFER, 0);

		// Draw to screen
		ctx.bindTexture(GL_TEXTURE_2D, fbo.getColorBuffer());
		ctx.viewport(0, 0, ctx.getWidth(), ctx.getHeight());
		sglr::drawQuad(ctx, texFromFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		// Read from screen
		ctx.readPixels(dst, 0, 0, ctx.getWidth(), ctx.getHeight());
	}
	else
	{
		// Read from fbo
		readPixels(ctx, dst, 0, 0, width, height, colorFormat, fboRangeInfo.lookupScale, fboRangeInfo.lookupBias);
	}
}